

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::recursive_directory_iterator::pop
          (recursive_directory_iterator *this,error_code *ec)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  _Elt_pointer pdVar4;
  __shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  iVar3 = depth(this);
  if (iVar3 == 0) {
    recursive_directory_iterator((recursive_directory_iterator *)&local_40);
    std::
    __shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                 *)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  else {
    do {
      std::
      deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
      ::pop_back(&(((this->_impl).
                    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_dir_iter_stack).c);
      peVar1 = (this->_impl).
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pdVar4 = ((iterator *)
               ((long)&(peVar1->_dir_iter_stack).c.
                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                       ._M_impl + 0x30))->_M_cur;
      if (pdVar4 == *(_Elt_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x38)) {
        pdVar4 = (*(_Map_pointer *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x48))[-1] + 0x20;
      }
      directory_iterator::increment(pdVar4 + -1,ec);
      iVar3 = depth(this);
      if (iVar3 == 0) {
        return;
      }
      peVar1 = (this->_impl).
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pdVar4 = ((iterator *)
               ((long)&(peVar1->_dir_iter_stack).c.
                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                       ._M_impl + 0x30))->_M_cur;
      if (pdVar4 == *(_Elt_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x38)) {
        pdVar4 = (*(_Map_pointer *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x48))[-1] + 0x20;
      }
      directory_iterator::directory_iterator((directory_iterator *)&local_40);
      bVar2 = directory_iterator::operator==(pdVar4 + -1,(directory_iterator *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    } while (bVar2);
  }
  return;
}

Assistant:

GHC_INLINE void recursive_directory_iterator::pop(std::error_code& ec)
{
    if (depth() == 0) {
        *this = recursive_directory_iterator();
    }
    else {
        do {
            _impl->_dir_iter_stack.pop();
            _impl->_dir_iter_stack.top().increment(ec);
        } while (depth() && _impl->_dir_iter_stack.top() == directory_iterator());
    }
}